

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall cs::token_value::dump(token_value *this,ostream *o)

{
  bool bVar1;
  reference pcVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  MappedConstReference<phmap::priv::FlatHashMapPolicy<char,_char>_> pcVar6;
  ostream *in_RSI;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_RDI;
  char ch_1;
  char ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *str;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  type_info *in_stack_ffffffffffffff78;
  string *psVar7;
  type_info *in_stack_ffffffffffffff80;
  ostream *in_stack_ffffffffffffff88;
  any *in_stack_ffffffffffffff98;
  string local_58 [38];
  char local_32;
  char local_31;
  undefined8 local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  std::operator<<(in_RSI,"< Value = ");
  cs_impl::any::type((any *)in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    std::operator<<(in_RSI,"\"");
    local_20 = cs_impl::any::const_val<std::__cxx11::string>((any *)in_RSI);
    local_18 = local_20;
    local_28._M_current = (char *)std::__cxx11::string::begin();
    local_30 = std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68), bVar1
          ) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      local_31 = *pcVar2;
      sVar4 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
              ::count<char>(in_RDI,(key_arg<char> *)in_stack_ffffffffffffff88);
      if (sVar4 == 0) {
        std::operator<<(in_RSI,local_31);
      }
      else {
        in_stack_ffffffffffffff88 = std::operator<<(in_RSI,'\\');
        pcVar6 = phmap::priv::
                 raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                 ::at<char,phmap::priv::FlatHashMapPolicy<char,char>>
                           ((raw_hash_map<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                             *)in_RDI,(key_arg<char> *)in_stack_ffffffffffffff88);
        std::operator<<(in_stack_ffffffffffffff88,*pcVar6);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_28);
    }
    std::operator<<(in_RSI,"\"");
  }
  else {
    cs_impl::any::type((any *)in_stack_ffffffffffffff70);
    bVar1 = std::type_info::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      std::operator<<(in_RSI,"\'");
      pcVar3 = cs_impl::any::const_val<char>((any *)in_RSI);
      local_32 = *pcVar3;
      sVar4 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
              ::count<char>(in_RDI,(key_arg<char> *)in_stack_ffffffffffffff88);
      if (sVar4 == 0) {
        std::operator<<(in_RSI,local_32);
      }
      else {
        poVar5 = std::operator<<(in_RSI,'\\');
        pcVar6 = phmap::priv::
                 raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                 ::at<char,phmap::priv::FlatHashMapPolicy<char,char>>
                           ((raw_hash_map<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                             *)in_RDI,(key_arg<char> *)in_stack_ffffffffffffff88);
        std::operator<<(poVar5,*pcVar6);
      }
      std::operator<<(in_RSI,"\'");
    }
    else {
      psVar7 = local_58;
      poVar5 = in_RSI;
      cs_impl::any::to_string_abi_cxx11_(in_stack_ffffffffffffff98);
      std::operator<<(in_RSI,psVar7);
      std::__cxx11::string::~string(local_58);
      in_RSI = poVar5;
    }
  }
  std::operator<<(in_RSI,">");
  return true;
}

Assistant:

bool token_value::dump(std::ostream &o) const
	{
		o << "< Value = ";
		if (mVal.type() == typeid(cs::string)) {
			o << "\"";
			const cs::string &str = mVal.const_val<cs::string>();
			for (auto ch: str) {
				if (escape_char.count(ch) > 0)
					o << '\\' << escape_char.at(ch);
				else
					o << ch;
			}
			o << "\"";
		}
		else if (mVal.type() == typeid(char)) {
			o << "\'";
			char ch = mVal.const_val<char>();
			if (escape_char.count(ch) > 0)
				o << '\\' << escape_char.at(ch);
			else
				o << ch;
			o << "\'";
		}
		else
			o << mVal.to_string();
		o << ">";
		return true;
	}